

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

void runpprop(runcxdef *ctx,uchar **codepp,objnum callobj,prpnum callprop,objnum obj,prpnum prop,
             int inh,int argc,objnum self)

{
  byte bVar1;
  errcxdef *peVar2;
  uchar **ppuVar3;
  uint uVar4;
  int iVar5;
  uchar *puVar6;
  objnum obj_00;
  ulong unaff_RBP;
  uint typ;
  uint uVar7;
  runsdef *prVar8;
  ushort *p0;
  objnum target;
  objnum obj_local;
  byte local_195;
  uint local_194;
  uint local_190;
  int local_18c;
  prpnum local_186;
  uint local_184;
  uchar **local_180;
  uint local_178;
  uint local_174;
  runsdef *local_170;
  errdef fr_;
  
  prVar8 = ctx->runcxsp;
  obj_local = obj;
  if (obj == 0xffff) {
    ctx->runcxerr->errcxptr->erraac = 0;
    runsign(ctx,0x410);
  }
  local_194 = (uint)prop;
  uVar4 = objgetap(ctx->runcxmem,obj,prop,&target,inh);
  if (uVar4 != 0) {
    local_18c = argc;
    prVar8 = prVar8 + -(long)argc;
    local_195 = 1;
    local_184 = (uint)self;
    local_190 = (uint)callobj;
    local_186 = callprop;
    local_180 = codepp;
    local_170 = prVar8;
    do {
      uVar7 = (uint)prVar8;
      puVar6 = mcmlck(ctx->runcxmem,target);
      iVar5 = _setjmp((__jmp_buf_tag *)fr_.errbuf);
      ppuVar3 = local_180;
      fr_.errcode = iVar5;
      if (iVar5 != 0) {
        ctx->runcxerr->errcxptr = fr_.errprv;
        mcmunlck(ctx->runcxmem,target);
        if (iVar5 - 0x3fcU < 0xfffffff9) {
          dbgds(ctx->runcxdbg);
        }
        errrse1(ctx->runcxerr,&fr_);
      }
      fr_.errprv = ctx->runcxerr->errcxptr;
      ctx->runcxerr->errcxptr = &fr_;
      p0 = (ushort *)(puVar6 + (ulong)uVar4 + 6);
      bVar1 = puVar6[(ulong)uVar4 + 2];
      typ = (uint)bVar1;
      if (bVar1 < 0xe) {
        if (typ != 6) {
          if (typ == 9) {
            outfmt(ctx->runcxtio,(uchar *)p0);
          }
          else {
LAB_001364ac:
            runpbuf(ctx,typ,p0);
          }
          goto LAB_0013653b;
        }
        if (local_180 == (uchar **)0x0) {
          runexe(ctx,(uchar *)p0,(objnum)local_184,target,(prpnum)local_194,local_18c);
          goto LAB_0013653b;
        }
        obj_00 = (objnum)local_190;
        local_178 = runcpsav(ctx,local_180,obj_00,(prpnum)uVar4);
        local_174 = local_178;
        runexe(ctx,(uchar *)p0,(objnum)local_184,target,(prpnum)local_194,local_18c);
        puVar6 = mcmlck(ctx->runcxmem,obj_00);
        *ppuVar3 = puVar6 + local_178;
        uVar4 = local_174;
      }
      else {
        if (bVar1 != 0xe) {
          if (typ != 0x10) goto LAB_001364ac;
          uVar7 = (uint)*p0;
        }
LAB_0013653b:
        uVar4 = (uint)unaff_RBP;
      }
      prVar8 = (runsdef *)(ulong)uVar7;
      mcmunlck(ctx->runcxmem,target);
      ppuVar3 = local_180;
      if (typ == 0x10) {
        runpprop(ctx,local_180,(objnum)local_190,local_186,(objnum)uVar7,(prpnum)local_194,0,
                 local_18c,(objnum)uVar7);
        ctx->runcxerr->errcxptr = fr_.errprv;
LAB_00136630:
        if (ctx->runcxsp != local_170) {
          return;
        }
        break;
      }
      peVar2 = ctx->runcxerr;
      peVar2->errcxptr = fr_.errprv;
      if (typ != 0xe) goto LAB_00136630;
      if ((local_195 & 1) == 0) {
        ctx->runcxerr->errcxptr->erraac = 0;
        runsign(ctx,0x40c);
      }
      if (local_180 != (uchar **)0x0) {
        uVar4 = runcpsav(ctx,local_180,(objnum)local_190,(prpnum)peVar2);
      }
      unaff_RBP = (ulong)uVar4;
      (*ctx->runcxdmd)(ctx->runcxdmc,obj_local,(prpnum)local_194);
      if (ppuVar3 != (uchar **)0x0) {
        puVar6 = mcmlck(ctx->runcxmem,(mcmon)local_190);
        *ppuVar3 = puVar6 + unaff_RBP;
      }
      uVar4 = objgetap(ctx->runcxmem,obj_local,(prpnum)local_194,&target,inh);
      local_195 = 0;
    } while (uVar4 != 0);
  }
  ctx->runcxsp->runstyp = '\x05';
  ctx->runcxsp = ctx->runcxsp + 1;
  return;
}

Assistant:

void runpprop(runcxdef *ctx, uchar *noreg *codepp,
              objnum callobj, prpnum callprop,
              noreg objnum obj, prpnum prop, int inh, int argc, objnum self)
{
    uint     pofs;
    uint     saveofs;
    objdef  *objptr;
    prpdef  *prpptr;
    uchar   *val;
    int      typ;
    runsdef  sval;
    objnum   target;
    int      times_through = 0;
    int      err;
	objnum   otherobj;
	runsdef *sp_ret;

	NOREG((&obj, &codepp));

	/* 
	 *   Note the initial stack pointer before arguments.  This is the stack
	 *   slot where the caller expects the return value to be placed on
	 *   return. 
	 */
	sp_ret = ctx->runcxsp - argc;

    if (obj == MCMONINV) runsig(ctx, ERR_RUNNOBJ);
    
startover:
    pofs = objgetap(ctx->runcxmem, obj, prop, &target, inh);
    
    /* if nothing was found, push nil */
    if (!pofs)
    {
		runpush(ctx, DAT_NIL, &sval);
        return;
    }

    /* found a property; get the prpdef, and the value and type of data */
    objptr = mcmlck(ctx->runcxmem, target);
    ERRBEGIN(ctx->runcxerr)         /* catch errors so we can unlock object */

    prpptr = (prpdef *)(((uchar *)objptr) + pofs);
    val = prpvalp(prpptr);
    typ = prptype(prpptr);

    /* determine what to do based on property type */
    switch(typ)
    {
    case DAT_CODE:
        /* save caller's code offset - caller's object may move */
        if (codepp)
            saveofs = runcpsav(ctx, codepp, callobj, callprop);
        
        /* execute the code */
        runexe(ctx, val, self, target, prop, argc);
        
        /* restore caller's code pointer in case object moved */
        if (codepp)
            *codepp = runcprst(ctx, saveofs, callobj, callprop);
        break;

    case DAT_REDIR:
        otherobj = osrp2(val);
        break;

    case DAT_DSTRING:
        outfmt(ctx->runcxtio, val);
        break;
        
    case DAT_DEMAND:
        break;
        
    default:
        runpbuf(ctx, typ, val);
        break;
    }

    /* we're done - unlock the object */
    mcmunlck(ctx->runcxmem, target);

    /* if it's redirected, redirect it now */
    if (typ == DAT_REDIR)
    {
        runpprop(ctx, codepp, callobj, callprop, otherobj, prop,
                 FALSE, argc, otherobj);
    }

    /* if an error occurs, unlock the object, and resignal the error */
    ERRCATCH(ctx->runcxerr, err)
        mcmunlck(ctx->runcxmem, target);
        if (err < ERR_RUNEXIT || err > ERR_RUNEXITOBJ)
            dbgdump(ctx->runcxdbg);                       /* dump the stack */
        errrse(ctx->runcxerr);
    ERREND(ctx->runcxerr)

    /* apply special handling for set-on-first-use data */
    if (typ == DAT_DEMAND)
    {
        /*
         *   if we've already done this, the property isn't being set by
         *   the callback, so we'll never get out of this loop - abort if
         *   so 
         */
        if (++times_through != 1)
            runsig(ctx, ERR_DMDLOOP);

        /* save caller's code offset - caller's object may move */
        if (codepp)
            saveofs = runcpsav(ctx, codepp, callobj, callprop);

        /* invoke the callback to set the property on demand */
        (*ctx->runcxdmd)(ctx->runcxdmc, obj, prop);

        /* restore caller's code pointer */
        if (codepp)
            *codepp = runcprst(ctx, saveofs, callobj, callprop);

        /* try again now that it's been set up */
        goto startover;
	}

	/* 
	 *   If the property invocation didn't push a return value onto the
	 *   stack, push nil as the default result.  *All* property calls must
	 *   yield a value, since our caller might assume that they can pop a
	 *   result.  If the caller pops a result and we don't provide one, the
	 *   stack will be corrupted.  To ensure this doesn't happen, push a
	 *   default nil result if the stack pointer is where it was before the
	 *   caller pushed our arguments.
	 */
	if (ctx->runcxsp == sp_ret)
		runpush(ctx, DAT_NIL, &sval);
}